

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O2

zt_log_ty * zt_log_logger(zt_log_ty *log)

{
  zt_log_ty *pzVar1;
  
  if (log_default_ptr == (zt_log_ty *)0x0 && log == (zt_log_ty *)0x0) {
    pzVar1 = zt_log_get_logger();
    return pzVar1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&log_mutex);
  pzVar1 = log_default_ptr;
  log_default_ptr = log;
  pthread_mutex_unlock((pthread_mutex_t *)&log_mutex);
  return pzVar1;
}

Assistant:

zt_log_ty *
zt_log_logger(zt_log_ty * log) {
    /* STATES:
     * log == NULL AND default == NULL           : create a new logger
     * log == NULL AND default == <logger>       : replace the current logger with log (NULL)
     * log == <logger> AND default == NULL       : replace the default logger with log
     * log == <logger> AND default == <logger>   : replace the default logger with log
     */

    /* if log is NULL and there is no default get one */
    if (log == NULL && log_default_ptr == NULL) {
        return zt_log_get_logger();
    }

    return zt_log_set_logger(log);
}